

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Increment_Numeric(Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  Var pvVar2;
  
  bVar1 = VarIs<Js::JavascriptBigInt>(aRight);
  if (bVar1) {
    pvVar2 = JavascriptBigInt::Increment(aRight);
    return pvVar2;
  }
  pvVar2 = Add(aRight,&DAT_1000000000001,scriptContext);
  return pvVar2;
}

Assistant:

Var JavascriptMath::Increment_Numeric(Var aRight, ScriptContext* scriptContext)
        {
            if (VarIs<JavascriptBigInt>(aRight))
            {
                return JavascriptBigInt::Increment(aRight);
            }
            return JavascriptMath::Add(aRight, TaggedInt::ToVarUnchecked(1), scriptContext);
        }